

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cc
# Opt level: O0

void __thiscall
TestSchema::printNext(TestSchema *this,Parser<avro::ReaderImpl<avro::Validator>_> *p)

{
  bool bVar1;
  Type TVar2;
  ostream *poVar3;
  string fieldName;
  string recordName;
  string *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  string local_50 [32];
  string local_30 [48];
  
  poVar3 = std::operator<<((ostream *)&std::cout,"Next: \"");
  TVar2 = avro::nextType((Parser<avro::ReaderImpl<avro::Validator>_> *)0x2b4aa6);
  avro::operator<<(poVar3,TVar2);
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::string(local_50);
  bVar1 = avro::currentRecordName
                    ((Parser<avro::ReaderImpl<avro::Validator>_> *)
                     CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                     in_stack_ffffffffffffff78);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"\" record: \"");
    std::operator<<(poVar3,local_30);
  }
  bVar1 = avro::nextFieldName((Parser<avro::ReaderImpl<avro::Validator>_> *)
                              CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                              in_stack_ffffffffffffff78);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"\" field: \"");
    std::operator<<(poVar3,local_50);
  }
  std::operator<<((ostream *)&std::cout,"\"\n");
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void printNext(Parser<ValidatingReader> &p)
    {
        std::cout << "Next: \"" << nextType(p);
        std::string recordName;
        std::string fieldName;
        if( currentRecordName(p, recordName) ) {
            std::cout << "\" record: \"" << recordName;
        }
        if( nextFieldName(p, fieldName) ) {
            std::cout << "\" field: \"" << fieldName;
        }
        std::cout << "\"\n";

    }